

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

void slang::ast::InstanceSymbol::fromSyntax
               (Compilation *comp,HierarchyInstantiationSyntax *syntax,ASTContext *context,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets,BindDirectiveInfo *bindInfo
               ,SyntaxNode *overrideSyntax)

{
  Token *this;
  char_pointer puVar1;
  group_type_pointer pgVar2;
  uchar *puVar3;
  SymbolKind SVar4;
  Symbol *pSVar5;
  pointer ppAVar6;
  size_t sVar7;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *phVar8;
  group_type_pointer pgVar9;
  value_type_pointer ppVar10;
  size_t __n;
  size_t sVar11;
  ConfigRule *configRule;
  uint uVar12;
  ResolvedConfig *pRVar13;
  char *__s1;
  byte bVar14;
  int iVar15;
  CheckerSymbol *checker;
  HierarchyOverrideNode *pHVar16;
  Scope *pSVar17;
  int *piVar18;
  uint64_t uVar19;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar20;
  char_pointer puVar21;
  slot_type *psVar22;
  uint uVar23;
  Scope *pSVar24;
  InstanceBodySymbol *pIVar25;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *phVar26;
  ulong uVar27;
  iterator __begin4;
  Symbol *pSVar28;
  undefined1 *puVar29;
  ConfigBlockSymbol *pCVar30;
  table_element_pointer ppVar31;
  ulong uVar32;
  ulong uVar33;
  bitmask<slang::ast::LookupFlags> flags;
  value_type_pointer ppVar34;
  value_type_pointer ppVar35;
  Compilation *this_00;
  char_pointer puVar36;
  bitmask<slang::ast::InstanceFlags> flags_00;
  long lVar37;
  HierarchyInstantiationSyntax *pHVar38;
  bool bVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  uchar uVar44;
  uchar uVar45;
  uchar uVar46;
  uchar uVar47;
  uchar uVar48;
  uchar uVar49;
  uchar uVar50;
  uchar uVar51;
  uchar uVar52;
  uchar uVar53;
  uchar uVar54;
  uchar uVar55;
  uchar uVar56;
  uchar uVar57;
  uchar uVar58;
  uchar uVar59;
  function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  detail;
  string_view name;
  string_view lookupName;
  string_view name_00;
  SourceRange sourceRange;
  string_view sVar60;
  iterator iVar61;
  bool inChecker;
  TimeTraceScope timeScope;
  ResolvedConfig *resolvedConfig;
  string_view defName;
  Symbol *sym;
  DefinitionSymbol *owningDefinition;
  DefinitionLookupResult defResult;
  anon_class_72_9_2532bcb6 createInstances;
  DefinitionLookupResult defResult_2;
  SmallVector<const_slang::ast::Symbol_*,_5UL> parentStack;
  string_view rootName;
  InstanceBuilder builder;
  bool local_3fa;
  TimeTraceScope local_3f9;
  value_type_pointer local_3f8;
  HierarchyInstantiationSyntax *local_3f0;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_3e8;
  value_type_pointer local_3e0;
  HierarchicalInstanceSyntax *local_3d8;
  Compilation *local_3d0;
  undefined8 local_3c8;
  uchar uStack_3c0;
  uchar uStack_3bf;
  uchar uStack_3be;
  uchar uStack_3bd;
  uchar uStack_3bc;
  uchar uStack_3bb;
  uchar uStack_3ba;
  uchar uStack_3b9;
  undefined1 *local_3b0;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_3a8;
  ulong local_3a0;
  ulong local_398;
  slot_type *local_390;
  Token *local_388;
  ResolvedConfig *local_380;
  string_view local_378;
  pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
  local_368;
  InstanceBodySymbol *local_348;
  Compilation *local_340;
  size_t local_338;
  DefinitionSymbol *local_330;
  string_view local_328;
  ConfigRule *local_318;
  ulong local_310;
  ulong local_308;
  ulong local_300;
  ConfigBlockSymbol *local_2f8;
  DefinitionLookupResult local_2f0;
  Symbol local_2d8;
  SourceRange local_298;
  SourceRange local_288;
  SourceRange local_278;
  SourceRange local_268;
  anon_class_72_9_2532bcb6 local_258;
  DefinitionLookupResult local_210;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0 [40];
  basic_string_view<char,_std::char_traits<char>_> local_1b8;
  undefined1 local_1a8 [144];
  undefined1 local_118 [32];
  undefined8 local_f8;
  undefined8 local_f0;
  NetType *local_e8;
  Compilation *local_e0;
  ASTContext *local_d8;
  undefined1 local_d0 [16];
  HierarchyOverrideNode *local_c0;
  undefined1 local_b8 [16];
  SyntaxNode *local_a8;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined1 local_80 [40];
  pointer local_58;
  HierarchicalInstanceSyntax *local_50;
  byte local_48;
  
  this = &syntax->type;
  local_3f8 = (value_type_pointer)results;
  local_3a8 = implicitNets;
  local_378 = parsing::Token::valueText(this);
  flags.m_bits = (underlying_type)implicitNets;
  local_1a8._0_8_ = &local_378;
  if (TimeTrace::profiler != 0) {
    detail.callable = (intptr_t)local_1a8;
    detail.callback =
         function_ref<std::__cxx11::string()>::
         callback_fn<slang::ast::InstanceSymbol::fromSyntax(slang::ast::Compilation&,slang::syntax::HierarchyInstantiationSyntax_const&,slang::ast::ASTContext_const&,slang::SmallVectorBase<slang::ast::Symbol_const*>&,slang::SmallVectorBase<slang::ast::Symbol_const*>&,slang::ast::BindDirectiveInfo_const*,slang::syntax::SyntaxNode_const*)::__0>
    ;
    sVar60._M_str = "createInstances";
    sVar60._M_len = 0xf;
    TimeTrace::beginTrace(sVar60,detail);
  }
  local_3fa = false;
  pSVar17 = (context->scope).ptr;
  bVar14 = 0;
  pSVar28 = (Symbol *)0x0;
  pSVar24 = pSVar17;
  do {
    pSVar5 = pSVar24->thisSym;
    SVar4 = pSVar5->kind;
    if (SVar4 == CheckerInstanceBody) {
      local_3fa = true;
      bVar14 = bVar14 | *(byte *)((long)&pSVar5[2].name._M_str + 5) & 5;
      pSVar24 = (Scope *)pSVar5[1].originatingSyntax[1].parent;
LAB_00241491:
      bVar39 = false;
    }
    else {
      if (SVar4 == GenerateBlock) {
        bVar14 = bVar14 | *(byte *)((long)&pSVar5[1].originatingSyntax + 4);
LAB_00241473:
        pSVar24 = pSVar5->parentScope;
        goto LAB_00241491;
      }
      if (SVar4 != InstanceBody) goto LAB_00241473;
      bVar14 = bVar14 | (byte)pSVar5[2].name._M_len & 5;
      bVar39 = true;
      pSVar28 = pSVar5;
    }
  } while ((!bVar39) && (pSVar24 != (Scope *)0x0));
  if ((bVar14 & 1) != 0) {
    UninstantiatedDefSymbol::fromSyntax
              (comp,syntax,context,(SmallVectorBase<const_slang::ast::Symbol_*> *)local_3f8,
               local_3a8);
    goto LAB_0024196d;
  }
  flags_00.m_bits = bVar14 | 2;
  if (bindInfo == (BindDirectiveInfo *)0x0) {
    flags_00.m_bits = bVar14;
  }
  name._M_str = (char *)0x2;
  name._M_len = (size_t)local_378._M_str;
  local_3c8 = (ConfigBlockSymbol *)bindInfo;
  checker = (CheckerSymbol *)
            Lookup::unqualified((Lookup *)pSVar17,(Scope *)local_378._M_len,name,flags);
  if ((checker != (CheckerSymbol *)0x0) && ((checker->super_Symbol).kind == Checker)) {
    CheckerInstanceSymbol::fromSyntax
              (checker,syntax,context,(SmallVectorBase<const_slang::ast::Symbol_*> *)local_3f8,
               local_3a8,flags_00);
    goto LAB_0024196d;
  }
  pHVar16 = (HierarchyOverrideNode *)0x0;
  local_330 = (DefinitionSymbol *)0x0;
  local_380 = (ResolvedConfig *)0x0;
  local_3f0 = syntax;
  if (pSVar28 != (Symbol *)0x0) {
    local_330 = (DefinitionSymbol *)pSVar28[2].name._M_str;
    if (*(long *)(pSVar28 + 2) == 0) {
      pHVar16 = (HierarchyOverrideNode *)0x0;
    }
    else {
      pHVar16 = anon_unknown.dwarf_70d0a0::findParentOverrideNode((context->scope).ptr);
    }
    if (pSVar28[1].originatingSyntax != (SyntaxNode *)0x0) {
      local_380 = (ResolvedConfig *)pSVar28[1].originatingSyntax[3].previewNode;
    }
    if ((flags_00.m_bits & 2) != 0) {
      if ((flags_00.m_bits & 4) != 0) {
        sourceRange = parsing::Token::range(this);
        ASTContext::addDiag(context,(DiagCode)0xb0006,sourceRange);
        goto LAB_0024196d;
      }
      flags_00.m_bits = flags_00.m_bits | 4;
    }
  }
  pHVar38 = local_3f0;
  ppAVar6 = (local_3f0->super_MemberSyntax).attributes.
            super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  local_3d8 = (HierarchicalInstanceSyntax *)
              (local_3f0->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent
              ._M_extent_value;
  local_1a8._128_8_ = local_1a8;
  local_118._0_8_ = 0x3f;
  local_118._8_8_ = 1;
  local_118._16_16_ = ZEXT816(0x49b460);
  local_f8 = 0;
  local_f0 = 0;
  local_3d0 = comp;
  local_388 = this;
  local_1a8._136_8_ = local_1a8._128_8_;
  local_e8 = Scope::getDefaultNetType((context->scope).ptr);
  sVar60 = local_378;
  pRVar13 = local_380;
  this_00 = local_3d0;
  local_98 = local_80;
  pSVar17 = (context->scope).ptr;
  local_e0 = pSVar17->compilation;
  local_d0 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_a8 = overrideSyntax;
  local_a0 = local_3a8;
  local_90 = 0;
  local_88 = 10;
  local_50 = local_3d8;
  local_258.comp = local_3d0;
  local_258.syntax = pHVar38;
  local_258.results = (SmallVectorBase<const_slang::ast::Symbol_*> *)local_3f8;
  local_258.implicitNets = local_3a8;
  local_258.builder = (InstanceBuilder *)local_1a8;
  local_258.owningDefinition = &local_330;
  local_258.inChecker = &local_3fa;
  local_258.resolvedConfig = &local_380;
  local_258.context = context;
  local_d8 = context;
  local_c0 = pHVar16;
  local_58 = ppAVar6;
  local_48 = flags_00.m_bits;
  if (local_3c8 == (ConfigBlockSymbol *)0x0) {
    if (local_380 != (ResolvedConfig *)0x0) {
      local_2f0.definition = &local_2d8;
      local_2f0.configRoot = (ConfigBlockSymbol *)0x0;
      local_2f0.configRule = (ConfigRule *)0x2;
      sVar11 = local_378._M_len;
      local_3a8 = (SmallVectorBase<const_slang::ast::Symbol_*> *)local_378._M_str;
      pCVar30 = local_380->useConfig;
      if (pCVar30->resolved == false) {
        ConfigBlockSymbol::resolve(pCVar30);
      }
      if ((pCVar30->instanceOverrides).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
          .size_ctrl.size != 0) {
        local_338 = sVar11;
        pSVar17 = (context->scope).ptr;
        local_1f8 = local_1e0;
        local_1f0 = (undefined1 *)0x0;
        local_1e8 = 5;
        local_3e0 = (value_type_pointer)context;
        do {
          local_368.first.definition = pSVar17->thisSym;
          if ((((InstanceSymbolBase *)
               &((InstanceBodySymbol *)local_368.first.definition)->super_Symbol)->super_Symbol).
              kind == InstanceBody) {
            local_368.first.definition =
                 (Symbol *)((InstanceBodySymbol *)local_368.first.definition)->parentInstance;
          }
          SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*const&>
                    ((SmallVectorBase<slang::ast::Symbol_const*> *)&local_1f8,(Symbol **)&local_368)
          ;
          this_00 = local_3d0;
          pSVar17 = (((InstanceSymbolBase *)&(local_368.first.definition)->kind)->super_Symbol).
                    parentScope;
        } while ((pSVar17 != (Scope *)0x0) &&
                ((InstanceBodySymbol *)pRVar13->rootInstance !=
                 (InstanceBodySymbol *)local_368.first.definition));
        piVar18 = *(int **)(local_1f8 + (long)local_1f0 * 8 + -8);
        if (*piVar18 == 0x2f) {
          piVar18 = *(int **)(*(long *)(piVar18 + 0x14) + 0x90);
        }
        local_1b8._M_len = *(size_t *)(piVar18 + 2);
        local_1b8._M_str = *(char **)(piVar18 + 4);
        uVar19 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            &pCVar30->instanceOverrides,&local_1b8);
        sVar11 = local_1b8._M_len;
        uVar32 = uVar19 >> ((byte)(pCVar30->instanceOverrides).table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                  .arrays.groups_size_index & 0x3f);
        local_390 = ((pCVar30->instanceOverrides).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                     .arrays.groups_)->m;
        lVar37 = (uVar19 & 0xff) * 4;
        uVar44 = (&UNK_0049b57c)[lVar37];
        uVar45 = (&UNK_0049b57d)[lVar37];
        uVar46 = (&UNK_0049b57e)[lVar37];
        uVar47 = (&UNK_0049b57f)[lVar37];
        local_3f8 = (value_type_pointer)local_1b8._M_str;
        puVar29 = (undefined1 *)(ulong)((uint)uVar19 & 7);
        phVar26 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)0x0;
        uVar48 = uVar44;
        uVar49 = uVar45;
        uVar50 = uVar46;
        uVar51 = uVar47;
        uVar52 = uVar44;
        uVar53 = uVar45;
        uVar54 = uVar46;
        uVar55 = uVar47;
        uVar56 = uVar44;
        uVar57 = uVar45;
        uVar58 = uVar46;
        uVar59 = uVar47;
        do {
          local_3d8 = (HierarchicalInstanceSyntax *)(uVar32 * 0x10);
          psVar22 = local_390 + (long)local_3d8;
          auVar40[0] = -(psVar22->n == uVar44);
          auVar40[1] = -(psVar22[1].n == uVar45);
          auVar40[2] = -(psVar22[2].n == uVar46);
          auVar40[3] = -(psVar22[3].n == uVar47);
          auVar40[4] = -(psVar22[4].n == uVar48);
          auVar40[5] = -(psVar22[5].n == uVar49);
          auVar40[6] = -(psVar22[6].n == uVar50);
          auVar40[7] = -(psVar22[7].n == uVar51);
          auVar40[8] = -(psVar22[8].n == uVar52);
          auVar40[9] = -(psVar22[9].n == uVar53);
          auVar40[10] = -(psVar22[10].n == uVar54);
          auVar40[0xb] = -(psVar22[0xb].n == uVar55);
          auVar40[0xc] = -(psVar22[0xc].n == uVar56);
          auVar40[0xd] = -(psVar22[0xd].n == uVar57);
          auVar40[0xe] = -(psVar22[0xe].n == uVar58);
          auVar40[0xf] = -(psVar22[0xf].n == uVar59);
          uVar23 = (uint)(ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe);
          local_3e8 = phVar26;
          local_398 = uVar32;
          if (uVar23 != 0) {
            ppVar34 = (pCVar30->instanceOverrides).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                      .arrays.elements_;
            local_3c8._0_2_ = CONCAT11(uVar45,uVar44);
            local_3c8._0_3_ = CONCAT12(uVar46,(undefined2)local_3c8);
            local_3c8._0_4_ = CONCAT13(uVar47,(undefined3)local_3c8);
            local_3c8._0_5_ = CONCAT14(uVar48,(undefined4)local_3c8);
            local_3c8._0_6_ = CONCAT15(uVar49,(undefined5)local_3c8);
            local_3c8._0_7_ = CONCAT16(uVar50,(undefined6)local_3c8);
            local_3c8 = (ConfigBlockSymbol *)CONCAT17(uVar51,(undefined7)local_3c8);
            uStack_3c0 = uVar52;
            uStack_3bf = uVar53;
            uStack_3be = uVar54;
            uStack_3bd = uVar55;
            uStack_3bc = uVar56;
            uStack_3bb = uVar57;
            uStack_3ba = uVar58;
            uStack_3b9 = uVar59;
            local_3b0 = puVar29;
            do {
              uVar12 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                }
              }
              ppVar35 = ppVar34 + uVar32 * 0xf + (ulong)uVar12;
              sVar7 = (ppVar35->first)._M_len;
              bVar39 = sVar11 == sVar7;
              if ((sVar11 != 0) && (sVar11 == sVar7)) {
                iVar15 = bcmp(local_3f8,(ppVar35->first)._M_str,sVar11);
                bVar39 = iVar15 == 0;
                uVar44 = (uchar)local_3c8;
                uVar45 = local_3c8._1_1_;
                uVar46 = local_3c8._2_1_;
                uVar47 = local_3c8._3_1_;
                uVar48 = local_3c8._4_1_;
                uVar49 = local_3c8._5_1_;
                uVar50 = local_3c8._6_1_;
                uVar51 = local_3c8._7_1_;
                uVar52 = uStack_3c0;
                uVar53 = uStack_3bf;
                uVar54 = uStack_3be;
                uVar55 = uStack_3bd;
                uVar56 = uStack_3bc;
                uVar57 = uStack_3bb;
                uVar58 = uStack_3ba;
                uVar59 = uStack_3b9;
              }
              this_00 = local_3d0;
              if (bVar39) goto LAB_00241bc6;
              uVar23 = uVar23 - 1 & uVar23;
              puVar29 = local_3b0;
            } while (uVar23 != 0);
          }
          if ((local_390[(long)((long)&(local_3d8->super_SyntaxNode).parent + 7)].n &
              puVar29[0x49b970]) == 0) {
            ppVar35 = (value_type_pointer)0x0;
            goto LAB_00241bc6;
          }
          phVar8 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                   (pCVar30->instanceOverrides).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                   .arrays.groups_size_mask;
          phVar26 = local_3e8 + 1;
          uVar32 = (ulong)(local_3e8 + local_398 + 1) & (ulong)phVar8;
        } while (phVar26 <= phVar8);
        ppVar35 = (value_type_pointer)0x0;
LAB_00241bc6:
        puVar29 = local_1f0;
        context = (ASTContext *)local_3e0;
        ppVar34 = local_3e0;
        pHVar38 = local_3f0;
        if (ppVar35 != (value_type_pointer)0x0) {
          do {
            phVar26 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      &ppVar35->second;
            puVar29 = puVar29 + -1;
            if (puVar29 == (undefined1 *)0x0) break;
            local_398 = *(ulong *)(local_1f8 + (long)puVar29 * 8 + -8);
            uVar19 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                               (phVar26,(basic_string_view<char,_std::char_traits<char>_> *)
                                        (local_398 + 8));
            uVar32 = uVar19 >> ((byte)(((InstanceOverride *)phVar26)->childNodes).table_.
                                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                      .arrays.groups_size_index & 0x3f);
            pgVar9 = (ppVar35->second).childNodes.table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                     .arrays.groups_;
            lVar37 = (uVar19 & 0xff) * 4;
            uVar44 = (&UNK_0049b57c)[lVar37];
            uVar45 = (&UNK_0049b57d)[lVar37];
            uVar46 = (&UNK_0049b57e)[lVar37];
            uVar47 = (&UNK_0049b57f)[lVar37];
            pIVar25 = (InstanceBodySymbol *)(ulong)((uint)uVar19 & 7);
            local_3a0 = 0;
            uVar48 = uVar44;
            uVar49 = uVar45;
            uVar50 = uVar46;
            uVar51 = uVar47;
            uVar52 = uVar44;
            uVar53 = uVar45;
            uVar54 = uVar46;
            uVar55 = uVar47;
            uVar56 = uVar44;
            uVar57 = uVar45;
            uVar58 = uVar46;
            uVar59 = uVar47;
            do {
              local_390 = (slot_type *)(uVar32 * 0x10);
              pgVar2 = pgVar9 + uVar32;
              auVar41[0] = -(pgVar2->m[0].n == uVar44);
              auVar41[1] = -(pgVar2->m[1].n == uVar45);
              auVar41[2] = -(pgVar2->m[2].n == uVar46);
              auVar41[3] = -(pgVar2->m[3].n == uVar47);
              auVar41[4] = -(pgVar2->m[4].n == uVar48);
              auVar41[5] = -(pgVar2->m[5].n == uVar49);
              auVar41[6] = -(pgVar2->m[6].n == uVar50);
              auVar41[7] = -(pgVar2->m[7].n == uVar51);
              auVar41[8] = -(pgVar2->m[8].n == uVar52);
              auVar41[9] = -(pgVar2->m[9].n == uVar53);
              auVar41[10] = -(pgVar2->m[10].n == uVar54);
              auVar41[0xb] = -(pgVar2->m[0xb].n == uVar55);
              auVar41[0xc] = -(pgVar2->m[0xc].n == uVar56);
              auVar41[0xd] = -(pgVar2->m[0xd].n == uVar57);
              auVar41[0xe] = -(pgVar2->m[0xe].n == uVar58);
              auVar41[0xf] = -(pgVar2->m[0xf].n == uVar59);
              uVar23 = (uint)(ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe);
              if (uVar23 != 0) {
                ppVar10 = *(value_type_pointer *)(phVar26 + 0x18);
                __n = *(size_t *)(local_398 + 8);
                local_3d8 = *(HierarchicalInstanceSyntax **)(local_398 + 0x10);
                local_3c8._0_2_ = CONCAT11(uVar45,uVar44);
                local_3c8._0_3_ = CONCAT12(uVar46,(undefined2)local_3c8);
                local_3c8._0_4_ = CONCAT13(uVar47,(undefined3)local_3c8);
                local_3c8._0_5_ = CONCAT14(uVar48,(undefined4)local_3c8);
                local_3c8._0_6_ = CONCAT15(uVar49,(undefined5)local_3c8);
                local_3c8._0_7_ = CONCAT16(uVar50,(undefined6)local_3c8);
                local_3c8 = (ConfigBlockSymbol *)CONCAT17(uVar51,(undefined7)local_3c8);
                local_3e8 = phVar26;
                uStack_3c0 = uVar52;
                uStack_3bf = uVar53;
                uStack_3be = uVar54;
                uStack_3bd = uVar55;
                uStack_3bc = uVar56;
                uStack_3bb = uVar57;
                uStack_3ba = uVar58;
                uStack_3b9 = uVar59;
                local_3b0 = puVar29;
                local_348 = pIVar25;
                do {
                  uVar12 = 0;
                  if (uVar23 != 0) {
                    for (; (uVar23 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                    }
                  }
                  ppVar35 = ppVar10 + uVar32 * 0xf + (ulong)uVar12;
                  sVar11 = (ppVar35->first)._M_len;
                  bVar39 = __n == sVar11;
                  if ((__n != 0) && (__n == sVar11)) {
                    local_3f8 = ppVar34;
                    iVar15 = bcmp(local_3d8,(ppVar35->first)._M_str,__n);
                    bVar39 = iVar15 == 0;
                    ppVar34 = local_3f8;
                    uVar44 = (uchar)local_3c8;
                    uVar45 = local_3c8._1_1_;
                    uVar46 = local_3c8._2_1_;
                    uVar47 = local_3c8._3_1_;
                    uVar48 = local_3c8._4_1_;
                    uVar49 = local_3c8._5_1_;
                    uVar50 = local_3c8._6_1_;
                    uVar51 = local_3c8._7_1_;
                    uVar52 = uStack_3c0;
                    uVar53 = uStack_3bf;
                    uVar54 = uStack_3be;
                    uVar55 = uStack_3bd;
                    uVar56 = uStack_3bc;
                    uVar57 = uStack_3bb;
                    uVar58 = uStack_3ba;
                    uVar59 = uStack_3b9;
                  }
                  puVar29 = local_3b0;
                  this_00 = local_3d0;
                  phVar26 = local_3e8;
                  pHVar38 = local_3f0;
                  if (bVar39) goto LAB_00241d96;
                  uVar23 = uVar23 - 1 & uVar23;
                  pIVar25 = local_348;
                } while (uVar23 != 0);
              }
              if (((local_390 + (long)pgVar9)[0xf].n &
                  *(byte *)&pIVar25[0x6692].hierarchyOverrideNode) == 0) break;
              lVar37 = uVar32 + local_3a0;
              local_3a0 = local_3a0 + 1;
              uVar32 = lVar37 + 1U & *(ulong *)(phVar26 + 8);
            } while (local_3a0 <= *(ulong *)(phVar26 + 8));
            ppVar35 = (value_type_pointer)0x0;
LAB_00241d96:
            ppVar34 = ppVar35;
          } while (ppVar35 != (value_type_pointer)0x0);
          context = (ASTContext *)local_3e0;
          if (((puVar29 == (undefined1 *)0x0) && (*(size_t *)(phVar26 + 0x28) != 0)) &&
             (uVar32 = (pHVar38->instances).elements._M_extent._M_extent_value + 1, 1 < uVar32)) {
            local_340 = *(Compilation **)(local_3e0->first)._M_len;
            local_3b0 = (undefined1 *)(uVar32 >> 1);
            psVar22 = (slot_type *)0x0;
            local_3a0 = 0;
            local_3e8 = phVar26;
            do {
              local_390 = psVar22;
              ppSVar20 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                   ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     *)((pHVar38->instances).elements._M_ptr + (long)psVar22 * 2));
              local_3d8 = (HierarchicalInstanceSyntax *)*ppSVar20;
              if (local_3d8->decl == (InstanceNameSyntax *)0x0) {
                sVar60 = (string_view)(ZEXT816(0x48a5a6) << 0x40);
              }
              else {
                sVar60 = parsing::Token::valueText(&local_3d8->decl->name);
              }
              local_328 = sVar60;
              uVar19 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                                 (phVar26,&local_328);
              __s1 = local_328._M_str;
              sVar11 = local_328._M_len;
              uVar33 = uVar19 >> ((byte)*phVar26 & 0x3f);
              local_398 = *(ulong *)(phVar26 + 0x10);
              lVar37 = (uVar19 & 0xff) * 4;
              uVar44 = (&UNK_0049b57c)[lVar37];
              uVar45 = (&UNK_0049b57d)[lVar37];
              uVar46 = (&UNK_0049b57e)[lVar37];
              uVar47 = (&UNK_0049b57f)[lVar37];
              uVar32 = (ulong)((uint)uVar19 & 7);
              uVar27 = 0;
              uVar48 = uVar44;
              uVar49 = uVar45;
              uVar50 = uVar46;
              uVar51 = uVar47;
              uVar52 = uVar44;
              uVar53 = uVar45;
              uVar54 = uVar46;
              uVar55 = uVar47;
              uVar56 = uVar44;
              uVar57 = uVar45;
              uVar58 = uVar46;
              uVar59 = uVar47;
              do {
                puVar3 = (uchar *)(local_398 + uVar33 * 0x10);
                auVar42[0] = -(*puVar3 == uVar44);
                auVar42[1] = -(puVar3[1] == uVar45);
                auVar42[2] = -(puVar3[2] == uVar46);
                auVar42[3] = -(puVar3[3] == uVar47);
                auVar42[4] = -(puVar3[4] == uVar48);
                auVar42[5] = -(puVar3[5] == uVar49);
                auVar42[6] = -(puVar3[6] == uVar50);
                auVar42[7] = -(puVar3[7] == uVar51);
                auVar42[8] = -(puVar3[8] == uVar52);
                auVar42[9] = -(puVar3[9] == uVar53);
                auVar42[10] = -(puVar3[10] == uVar54);
                auVar42[0xb] = -(puVar3[0xb] == uVar55);
                auVar42[0xc] = -(puVar3[0xc] == uVar56);
                auVar42[0xd] = -(puVar3[0xd] == uVar57);
                auVar42[0xe] = -(puVar3[0xe] == uVar58);
                auVar42[0xf] = -(puVar3[0xf] == uVar59);
                uVar23 = (uint)(ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe);
                local_308 = uVar27;
                local_300 = uVar33;
                if (uVar23 != 0) {
                  ppVar34 = *(value_type_pointer *)(local_3e8 + 0x18);
                  local_3c8._0_2_ = CONCAT11(uVar45,uVar44);
                  local_3c8._0_3_ = CONCAT12(uVar46,(undefined2)local_3c8);
                  local_3c8._0_4_ = CONCAT13(uVar47,(undefined3)local_3c8);
                  local_3c8._0_5_ = CONCAT14(uVar48,(undefined4)local_3c8);
                  local_3c8._0_6_ = CONCAT15(uVar49,(undefined5)local_3c8);
                  local_3c8._0_7_ = CONCAT16(uVar50,(undefined6)local_3c8);
                  local_3c8 = (ConfigBlockSymbol *)CONCAT17(uVar51,(undefined7)local_3c8);
                  uStack_3c0 = uVar52;
                  uStack_3bf = uVar53;
                  uStack_3be = uVar54;
                  uStack_3bd = uVar55;
                  uStack_3bc = uVar56;
                  uStack_3bb = uVar57;
                  uStack_3ba = uVar58;
                  uStack_3b9 = uVar59;
                  local_310 = uVar32;
                  do {
                    uVar12 = 0;
                    if (uVar23 != 0) {
                      for (; (uVar23 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                      }
                    }
                    ppVar35 = ppVar34 + uVar33 * 0xf + (ulong)uVar12;
                    sVar7 = (ppVar35->first)._M_len;
                    bVar39 = sVar11 == sVar7;
                    if ((sVar11 != 0) && (sVar11 == sVar7)) {
                      iVar15 = bcmp(__s1,(ppVar35->first)._M_str,sVar11);
                      bVar39 = iVar15 == 0;
                      uVar44 = (uchar)local_3c8;
                      uVar45 = local_3c8._1_1_;
                      uVar46 = local_3c8._2_1_;
                      uVar47 = local_3c8._3_1_;
                      uVar48 = local_3c8._4_1_;
                      uVar49 = local_3c8._5_1_;
                      uVar50 = local_3c8._6_1_;
                      uVar51 = local_3c8._7_1_;
                      uVar52 = uStack_3c0;
                      uVar53 = uStack_3bf;
                      uVar54 = uStack_3be;
                      uVar55 = uStack_3bd;
                      uVar56 = uStack_3bc;
                      uVar57 = uStack_3bb;
                      uVar58 = uStack_3ba;
                      uVar59 = uStack_3b9;
                    }
                    pHVar38 = local_3f0;
                    if (bVar39) goto LAB_00242001;
                    uVar23 = uVar23 - 1 & uVar23;
                    uVar32 = local_310;
                  } while (uVar23 != 0);
                }
                if ((*(byte *)(uVar33 * 0x10 + local_398 + 0xf) &
                    (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      is_not_overflowed(unsigned_long)::shift)[uVar32]) == 0) {
                  local_3f8 = (value_type_pointer)0x0;
                  ppVar35 = local_3f8;
                  goto LAB_00242001;
                }
                uVar27 = local_308 + 1;
                uVar33 = local_300 + local_308 + 1 & *(ulong *)(local_3e8 + 8);
              } while (uVar27 <= *(ulong *)(local_3e8 + 8));
              local_3f8 = (value_type_pointer)0x0;
              ppVar35 = local_3f8;
LAB_00242001:
              local_3f8 = ppVar35;
              context = (ASTContext *)local_3e0;
              phVar26 = local_3e8;
              ppVar34 = local_3f8;
              if ((local_3f8 == (value_type_pointer)0x0) ||
                 (configRule = (local_3f8->second).rule, configRule == (ConfigRule *)0x0)) {
                pCVar30 = local_2f8;
                if ((local_3a0 & 1) == 0) {
                  pSVar17 = (Scope *)(local_3e0->first)._M_len;
                  local_278 = parsing::Token::range(local_388);
                  name_00._M_str = (char *)local_3a8;
                  name_00._M_len = local_338;
                  Compilation::getDefinition
                            (&local_368.first,local_340,name_00,pSVar17,local_278,(DiagCode)0xcf0006
                            );
                  local_318 = local_368.first.configRule;
                  local_3a0 = CONCAT71((int7)((ulong)local_368.first.configRule >> 8),1);
                  local_348 = (InstanceBodySymbol *)local_368.first.definition;
                  pCVar30 = local_368.first.configRoot;
                }
                local_368.first.configRule = local_318;
                local_368.second = local_3d8;
                local_368.first.definition = &local_348->super_Symbol;
                local_368.first.configRoot = pCVar30;
                SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                ::
                emplace_back<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                          ((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                            *)&local_2f0,&local_368);
                local_3c8 = pCVar30;
                local_2f8 = pCVar30;
              }
              else {
                pSVar17 = (Scope *)(local_3e0->first)._M_len;
                local_268 = slang::syntax::SyntaxNode::sourceRange(&local_3d8->super_SyntaxNode);
                phVar26 = local_3e8;
                lookupName._M_str = (char *)local_3a8;
                lookupName._M_len = local_338;
                Compilation::getDefinition
                          (&local_210,local_340,lookupName,pSVar17,configRule,local_268,
                           (DiagCode)0xcf0006);
                local_368.first.configRule = local_210.configRule;
                local_368.first.definition = local_210.definition;
                local_368.first.configRoot = local_210.configRoot;
                local_368.second = local_3d8;
                SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                ::
                emplace_back<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                          ((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                            *)&local_2f0,&local_368);
                local_3c8 = local_210.configRoot;
                pHVar38 = local_3f0;
              }
              if ((ppVar34 != (value_type_pointer)0x0) && (local_3c8 != (ConfigBlockSymbol *)0x0)) {
                iVar61 = boost::unordered::detail::foa::
                         table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                         ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                  *)&local_3f8->second);
                if (iVar61.p_ != (table_element_pointer)0x0) {
LAB_0024220e:
                  anon_unknown.dwarf_70d0a0::checkForInvalidNestedConfigNodes
                            (context,&(iVar61.p_)->second,local_3c8);
                  puVar21 = iVar61.pc_ + 2;
                  do {
                    puVar36 = puVar21;
                    puVar21 = iVar61.pc_;
                    ppVar31 = iVar61.p_ + 1;
                    if (((uint)iVar61.pc_ & 0xf) == 0xe) goto LAB_00242257;
                    puVar1 = puVar36 + -1;
                    iVar61.p_ = ppVar31;
                    iVar61.pc_ = puVar21 + 1;
                    puVar21 = puVar36 + 1;
                  } while (*puVar1 == '\0');
                  puVar36 = puVar36 + -1;
                  if (*puVar1 == '\x01') {
                    ppVar31 = (table_element_pointer)0x0;
                  }
                  goto LAB_0024224c;
                }
              }
LAB_002422af:
              psVar22 = local_390 + 1;
              this_00 = local_3d0;
            } while (psVar22 != (slot_type *)local_3b0);
          }
        }
        if (local_1f8 != local_1e0) {
          operator_delete(local_1f8);
        }
      }
      if (local_2f0.configRoot != (ConfigBlockSymbol *)0x0) {
        lVar37 = (long)local_2f0.configRoot << 5;
        pSVar28 = local_2f0.definition;
        do {
          fromSyntax::anon_class_72_9_2532bcb6::operator()
                    (&local_258,(DefinitionLookupResult *)pSVar28,
                     *(HierarchicalInstanceSyntax **)&(pSVar28->location).field_0x0);
          pSVar28 = (Symbol *)&pSVar28->parentScope;
          lVar37 = lVar37 + -0x20;
        } while (lVar37 != 0);
        if (local_2f0.definition != &local_2d8) {
          operator_delete(local_2f0.definition);
        }
        goto LAB_0024194b;
      }
      if (local_2f0.definition != &local_2d8) {
        operator_delete(local_2f0.definition);
      }
    }
    sVar60 = local_378;
    pSVar17 = (Scope *)(((value_type_pointer)context)->first)._M_len;
    local_298 = parsing::Token::range(local_388);
    Compilation::getDefinition(&local_2f0,this_00,sVar60,pSVar17,local_298,(DiagCode)0xcf0006);
    fromSyntax::anon_class_72_9_2532bcb6::operator()
              (&local_258,&local_2f0,(HierarchicalInstanceSyntax *)0x0);
  }
  else {
    local_288 = parsing::Token::range(local_388);
    Compilation::getDefinition
              (&local_2f0,this_00,sVar60,pSVar17,local_288,(BindDirectiveInfo *)local_3c8);
    pCVar30 = local_3c8;
    if ((local_2f0.configRoot != (ConfigBlockSymbol *)0x0) &&
       (local_380 = BumpAllocator::
                    emplace<slang::ast::ResolvedConfig,slang::ast::ConfigBlockSymbol_const&,slang::ast::InstanceSymbol_const&>
                              (&this_00->super_BumpAllocator,local_2f0.configRoot,
                               (InstanceSymbol *)pSVar28[1].originatingSyntax),
       *(bool *)&(pCVar30->super_Symbol).indexInScope == false)) {
      local_2f0.configRoot = (ConfigBlockSymbol *)0x0;
      sVar11 = ((__extent_storage<18446744073709551615UL> *)&(pCVar30->super_Symbol).nextInScope)->
               _M_extent_value;
      (local_380->liblist)._M_ptr =
           ((span<const_slang::SourceLibrary_*const,_18446744073709551615UL> *)
           &(pCVar30->super_Symbol).parentScope)->_M_ptr;
      (local_380->liblist)._M_extent._M_extent_value = sVar11;
    }
    fromSyntax::anon_class_72_9_2532bcb6::operator()
              (&local_258,&local_2f0,(HierarchicalInstanceSyntax *)0x0);
  }
LAB_0024194b:
  if (local_98 != local_80) {
    operator_delete(local_98);
  }
  boost::unordered::detail::foa::
  table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::delete_((allocator_type)local_1a8._136_8_,
            (table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
             *)local_118);
LAB_0024196d:
  TimeTraceScope::~TimeTraceScope(&local_3f9);
  return;
LAB_00242257:
  do {
    auVar43[0] = -(*puVar36 == '\0');
    auVar43[1] = -(puVar36[1] == '\0');
    auVar43[2] = -(puVar36[2] == '\0');
    auVar43[3] = -(puVar36[3] == '\0');
    auVar43[4] = -(puVar36[4] == '\0');
    auVar43[5] = -(puVar36[5] == '\0');
    auVar43[6] = -(puVar36[6] == '\0');
    auVar43[7] = -(puVar36[7] == '\0');
    auVar43[8] = -(puVar36[8] == '\0');
    auVar43[9] = -(puVar36[9] == '\0');
    auVar43[10] = -(puVar36[10] == '\0');
    auVar43[0xb] = -(puVar36[0xb] == '\0');
    auVar43[0xc] = -(puVar36[0xc] == '\0');
    auVar43[0xd] = -(puVar36[0xd] == '\0');
    auVar43[0xe] = -(puVar36[0xe] == '\0');
    auVar43[0xf] = -(puVar36[0xf] == '\0');
    uVar23 = (uint)(ushort)((ushort)(SUB161(auVar43 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe);
    if (uVar23 == 0x7fff) {
      puVar36 = puVar36 + 0x10;
      ppVar31 = ppVar31 + 0xf;
    }
    else {
      uVar12 = 0;
      if ((uVar23 ^ 0x7fff) != 0) {
        for (; ((uVar23 ^ 0x7fff) >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
        }
      }
      if (puVar36[uVar12] == '\x01') {
        ppVar31 = (table_element_pointer)0x0;
      }
      else {
        puVar36 = puVar36 + uVar12;
        ppVar31 = ppVar31 + uVar12;
      }
    }
  } while (uVar23 == 0x7fff);
LAB_0024224c:
  iVar61.p_ = ppVar31;
  iVar61.pc_ = puVar36;
  if (ppVar31 == (table_element_pointer)0x0) goto LAB_002422af;
  goto LAB_0024220e;
}

Assistant:

void InstanceSymbol::fromSyntax(Compilation& comp, const HierarchyInstantiationSyntax& syntax,
                                const ASTContext& context, SmallVectorBase<const Symbol*>& results,
                                SmallVectorBase<const Symbol*>& implicitNets,
                                const BindDirectiveInfo* bindInfo,
                                const SyntaxNode* overrideSyntax) {
    auto defName = syntax.type.valueText();
    TimeTraceScope timeScope("createInstances"sv, [&] { return std::string(defName); });

    // Find our parent instance, if there is one.
    bitmask<InstanceFlags> flags;
    bool inChecker = false;
    const InstanceBodySymbol* parentInst = nullptr;
    const Scope* currScope = context.scope;
    do {
        auto& sym = currScope->asSymbol();
        if (sym.kind == SymbolKind::InstanceBody) {
            parentInst = &sym.as<InstanceBodySymbol>();
            flags |= parentInst->flags & ~InstanceFlags::FromBind;
            break;
        }

        if (sym.kind == SymbolKind::CheckerInstanceBody) {
            auto& body = sym.as<CheckerInstanceBodySymbol>();
            inChecker = true;
            flags |= body.flags & ~InstanceFlags::FromBind;
            currScope = body.parentInstance->getParentScope();
            continue;
        }

        if (sym.kind == SymbolKind::GenerateBlock) {
            if (sym.as<GenerateBlockSymbol>().isUninstantiated)
                flags |= InstanceFlags::Uninstantiated;
        }
        currScope = sym.getParentScope();
    } while (currScope);

    // If this instance is not instantiated then we'll just fill in a placeholder
    // and move on. This is likely inside an untaken generate branch.
    if (flags.has(InstanceFlags::Uninstantiated)) {
        UninstantiatedDefSymbol::fromSyntax(comp, syntax, context, results, implicitNets);
        return;
    }

    if (bindInfo)
        flags |= InstanceFlags::FromBind;

    // Unfortunately this instantiation could be for a checker instead of a
    // module/interface/program, so we're forced to do a real name lookup here
    // in the local scope before doing a global definition lookup.
    if (auto sym = Lookup::unqualified(*context.scope, defName, LookupFlags::AllowDeclaredAfter)) {
        if (sym->kind == SymbolKind::Checker) {
            CheckerInstanceSymbol::fromSyntax(sym->as<CheckerSymbol>(), syntax, context, results,
                                              implicitNets, flags);
            return;
        }
    }

    const DefinitionSymbol* owningDefinition = nullptr;
    const HierarchyOverrideNode* parentOverrideNode = nullptr;
    const ResolvedConfig* resolvedConfig = nullptr;
    if (parentInst) {
        owningDefinition = &parentInst->getDefinition();

        // In the uncommon case that our parent instance has an override
        // node set, we need to go back and make sure we account for any
        // generate blocks that might actually be along the parent path for
        // the new instances we're creating.
        if (parentInst->hierarchyOverrideNode)
            parentOverrideNode = findParentOverrideNode(*context.scope);

        // Check if our parent has a configuration applied. If so, and if
        // that configuration has instance overrides, we need to check if
        // any of them apply to the instances we're about to create.
        if (parentInst->parentInstance)
            resolvedConfig = parentInst->parentInstance->resolvedConfig;

        if (flags.has(InstanceFlags::FromBind)) {
            if (flags.has(InstanceFlags::ParentFromBind)) {
                context.addDiag(diag::BindUnderBind, syntax.type.range());
                return;
            }

            // If our parent is from a bind statement, pass down the flag
            // so that we prevent further binds below us too.
            flags |= InstanceFlags::ParentFromBind;
        }
    }

    InstanceBuilder builder(context, implicitNets, parentOverrideNode, syntax.attributes, flags,
                            overrideSyntax);

    // Creates instance symbols -- if specificInstance is provided then only that
    // instance will be created, otherwise all instances in the original syntax
    // node will be created in one go.
    auto createInstances = [&](const Compilation::DefinitionLookupResult& defResult,
                               const HierarchicalInstanceSyntax* specificInstance) {
        auto def = defResult.definition;
        if (!def) {
            UninstantiatedDefSymbol::fromSyntax(comp, syntax, specificInstance, context, results,
                                                implicitNets, builder.implicitNetNames,
                                                builder.netType);
            return;
        }

        auto confRule = defResult.configRule;
        auto addDiag = [&](DiagCode code) -> Diagnostic& {
            if (confRule) {
                SLANG_ASSERT(specificInstance);
                auto& diag = context.addDiag(code, specificInstance->sourceRange());
                diag.addNote(diag::NoteConfigRule, confRule->syntax->sourceRange());
                return diag;
            }
            else {
                auto& diag = context.addDiag(code, syntax.type.range());
                if (specificInstance)
                    diag << specificInstance->sourceRange();
                return diag;
            }
        };

        if (def->kind == SymbolKind::Primitive) {
            PrimitiveInstanceSymbol::fromSyntax(def->as<PrimitiveSymbol>(), syntax,
                                                specificInstance, context, results, implicitNets,
                                                builder.implicitNetNames);
            if (!results.empty()) {
                if (!owningDefinition ||
                    owningDefinition->definitionKind != DefinitionKind::Module || inChecker) {
                    addDiag(diag::InvalidPrimInstanceForParent);
                }
                else if (confRule && confRule->paramOverrides) {
                    addDiag(diag::ConfigParamsForPrimitive);
                }
            }
            return;
        }

        auto& definition = def->as<DefinitionSymbol>();
        definition.noteInstantiated();

        if (inChecker) {
            addDiag(diag::InvalidInstanceForParent)
                << definition.getArticleKindString() << "a checker"sv;
        }
        else if (owningDefinition) {
            auto owningKind = owningDefinition->definitionKind;
            if (owningKind == DefinitionKind::Program ||
                (owningKind == DefinitionKind::Interface &&
                 definition.definitionKind == DefinitionKind::Module)) {
                addDiag(diag::InvalidInstanceForParent) << definition.getArticleKindString()
                                                        << owningDefinition->getArticleKindString();
            }
        }

        ParameterBuilder paramBuilder(*context.scope, definition.name, definition.parameters);
        if (syntax.parameters)
            paramBuilder.setAssignments(*syntax.parameters, /* isFromConfig */ false);

        auto localConfig = resolvedConfig;
        if (confRule) {
            SLANG_ASSERT(resolvedConfig);
            auto rc = comp.emplace<ResolvedConfig>(*resolvedConfig);
            rc->configRule = confRule;

            confRule->isUsed = true;
            if (confRule->liblist)
                rc->liblist = *confRule->liblist;
            localConfig = rc;

            if (confRule->paramOverrides) {
                paramBuilder.setConfigScope(rc->useConfig);
                paramBuilder.setAssignments(*confRule->paramOverrides, /* isFromConfig */ true);
            }
        }

        builder.reset(definition, paramBuilder, localConfig, defResult.configRoot);

        if (specificInstance) {
            results.push_back(builder.create(*specificInstance));
        }
        else {
            // NOLINTNEXTLINE
            for (auto instanceSyntax : syntax.instances)
                results.push_back(builder.create(*instanceSyntax));
        }
    };

    // If we came here from a bind directive we need to make use
    // of the definition / config info that has already been resolved.
    if (bindInfo) {
        auto defResult = comp.getDefinition(defName, *context.scope, syntax.type.range(),
                                            *bindInfo);
        if (defResult.configRoot) {
            SLANG_ASSERT(parentInst && parentInst->parentInstance);
            auto rc = comp.emplace<ResolvedConfig>(*defResult.configRoot,
                                                   *parentInst->parentInstance);
            resolvedConfig = rc;

            if (!bindInfo->isNewConfigRoot) {
                // This is not a new config root, so normally we'd use our parent's
                // config. For binds though we don't know the right parent scope
                // because it's the scope that contains the bind directive, not the
                // one that contains the instance, so recreate it here.
                defResult.configRoot = nullptr;
                rc->liblist = bindInfo->liblist;
            }
        }

        createInstances(defResult, nullptr);
        return;
    }

    if (resolvedConfig) {
        ResolvedInstanceRules instanceRules;
        resolveInstanceOverrides(*resolvedConfig, context, syntax, defName, diag::UnknownModule,
                                 instanceRules);
        if (!instanceRules.empty()) {
            for (auto& [defResult, instSyntax] : instanceRules)
                createInstances(defResult, instSyntax);
            return;
        }
    }

    // Simple case: look up the definition and create all instances in one go.
    auto defResult = comp.getDefinition(defName, *context.scope, syntax.type.range(),
                                        diag::UnknownModule);
    createInstances(defResult, nullptr);
}